

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator
          (cmGhsMultiTargetGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  cmLocalGenerator *pcVar2;
  cmMakefile *pcVar3;
  string *psVar4;
  char *pcVar5;
  allocator<char> local_41;
  string local_40;
  
  this->_vptr_cmGhsMultiTargetGenerator = (_func_int **)&PTR__cmGhsMultiTargetGenerator_0058ad90;
  this->GeneratorTarget = target;
  pcVar2 = cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = (cmLocalGhsMultiGenerator *)pcVar2;
  pcVar3 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar3;
  p_Var1 = &(this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->TargetNameReal)._M_dataplus._M_p = (pointer)&(this->TargetNameReal).field_2;
  (this->TargetNameReal)._M_string_length = 0;
  (this->TargetNameReal).field_2._M_local_buf[0] = '\0';
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::string((string *)&this->Name,(string *)psVar4);
  (this->ConfigName)._M_dataplus._M_p = (pointer)&(this->ConfigName).field_2;
  (this->ConfigName)._M_string_length = 0;
  (this->ConfigName).field_2._M_local_buf[0] = '\0';
  this->CmdWindowsShell = false;
  pcVar3 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_BUILD_TYPE",&local_41);
  pcVar5 = cmMakefile::GetDefinition(pcVar3,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (pcVar5 == (char *)0x0) {
    (this->ConfigName)._M_string_length = 0;
    *(this->ConfigName)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::assign((char *)&this->ConfigName);
  }
  return;
}

Assistant:

cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator(cmGeneratorTarget* target)
  : GeneratorTarget(target)
  , LocalGenerator(
      static_cast<cmLocalGhsMultiGenerator*>(target->GetLocalGenerator()))
  , Makefile(target->Target->GetMakefile())
  , Name(target->GetName())
#ifdef _WIN32
  , CmdWindowsShell(true)
#else
  , CmdWindowsShell(false)
#endif
{
  // Store the configuration name that is being used
  if (const char* config = this->Makefile->GetDefinition("CMAKE_BUILD_TYPE")) {
    // Use the build type given by the user.
    this->ConfigName = config;
  } else {
    // No configuration type given.
    this->ConfigName.clear();
  }
}